

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void glist_glist(_glist *g,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *sym_00;
  _glist *p_Var1;
  _undo *p_Var2;
  _glist *x;
  void *data;
  t_float x1_00;
  t_float y1_00;
  t_float x2_00;
  t_float y2_00;
  t_float px1_00;
  t_float py1_00;
  t_float px2_00;
  t_float py2_00;
  t_float py2;
  t_float px2;
  t_float py1;
  t_float px1;
  t_float y2;
  t_float x2;
  t_float y1;
  t_float x1;
  t_symbol *sym;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _glist *g_local;
  
  sym_00 = atom_getsymbolarg(0,argc,argv);
  x1_00 = atom_getfloatarg(1,argc,argv);
  y1_00 = atom_getfloatarg(2,argc,argv);
  x2_00 = atom_getfloatarg(3,argc,argv);
  y2_00 = atom_getfloatarg(4,argc,argv);
  px1_00 = atom_getfloatarg(5,argc,argv);
  py1_00 = atom_getfloatarg(6,argc,argv);
  px2_00 = atom_getfloatarg(7,argc,argv);
  py2_00 = atom_getfloatarg(8,argc,argv);
  glist_addglist(g,sym_00,x1_00,y1_00,x2_00,y2_00,px1_00,py1_00,px2_00,py2_00);
  p_Var1 = glist_getcanvas(g);
  p_Var2 = canvas_undo_get(p_Var1);
  if (p_Var2->u_doing == 0) {
    p_Var1 = glist_getcanvas(g);
    x = glist_getcanvas(g);
    data = canvas_undo_set_create(x);
    canvas_undo_add(p_Var1,UNDO_CREATE,"create",data);
  }
  return;
}

Assistant:

void glist_glist(t_glist *g, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *sym = atom_getsymbolarg(0, argc, argv);
    t_float x1 = atom_getfloatarg(1, argc, argv);
    t_float y1 = atom_getfloatarg(2, argc, argv);
    t_float x2 = atom_getfloatarg(3, argc, argv);
    t_float y2 = atom_getfloatarg(4, argc, argv);
    t_float px1 = atom_getfloatarg(5, argc, argv);
    t_float py1 = atom_getfloatarg(6, argc, argv);
    t_float px2 = atom_getfloatarg(7, argc, argv);
    t_float py2 = atom_getfloatarg(8, argc, argv);
    glist_addglist(g, sym, x1, y1, x2, y2, px1, py1, px2, py2);
    if (!canvas_undo_get(glist_getcanvas(g))->u_doing)
        canvas_undo_add(glist_getcanvas(g), UNDO_CREATE, "create",
            (void *)canvas_undo_set_create(glist_getcanvas(g)));
}